

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void printTo<int,char,String>(FILE *fp,String *fmtstr,int *args,char *args_1,String *args_2)

{
  String local_30;
  
  format<int,char,String>(&local_30,fmtstr,args,args_1,args_2);
  fputs(local_30._string._M_dataplus._M_p,(FILE *)fp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._string._M_dataplus._M_p != &local_30._string.field_2) {
    operator_delete(local_30._string._M_dataplus._M_p);
  }
  return;
}

Assistant:

void printTo (FILE* fp, const String& fmtstr, const argtypes&... args)
{
	fprintf (fp, "%s", format (fmtstr, args...).c_str());
}